

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::AssignUInt64(Bignum *this,uint64_t value)

{
  uint *puVar1;
  int i;
  long lVar2;
  
  Zero(this);
  if (value != 0) {
    puVar1 = (this->bigits_).start_;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      puVar1[lVar2] = (uint)value & 0xfffffff;
      value = value >> 0x1c;
    }
    this->used_digits_ = 3;
    Clamp(this);
    return;
  }
  return;
}

Assistant:

void Bignum::AssignUInt64(uint64_t value) {
  const int kUInt64Size = 64;

  Zero();
  if (value == 0) return;

  int needed_bigits = kUInt64Size / kBigitSize + 1;
  EnsureCapacity(needed_bigits);
  for (int i = 0; i < needed_bigits; ++i) {
    bigits_[i] = value & kBigitMask;
    value = value >> kBigitSize;
  }
  used_digits_ = needed_bigits;
  Clamp();
}